

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenGlobalSetSetValue(BinaryenExpressionRef expr,BinaryenExpressionRef valueExpr)

{
  if (expr->_id != GlobalSetId) {
    __assert_fail("expression->is<GlobalSet>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x9ac,
                  "void BinaryenGlobalSetSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (valueExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = valueExpr;
    return;
  }
  __assert_fail("valueExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x9ad,
                "void BinaryenGlobalSetSetValue(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenGlobalSetSetValue(BinaryenExpressionRef expr,
                               BinaryenExpressionRef valueExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<GlobalSet>());
  assert(valueExpr);
  static_cast<GlobalSet*>(expression)->value = (Expression*)valueExpr;
}